

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float rounding,
                   int rounding_corners_flags,float thickness)

{
  ImVec2 local_20;
  ImVec2 local_18;
  
  if (0xffffff < col) {
    if ((this->Flags & 1) == 0) {
      local_18.x = (*a).x + 0.5;
      local_18.y = (*a).y + 0.5;
      local_20.x = (*b).x + -0.49;
      local_20.y = (*b).y + -0.49;
    }
    else {
      local_18.x = (*a).x + 0.5;
      local_18.y = (*a).y + 0.5;
      local_20.x = (*b).x + -0.5;
      local_20.y = (*b).y + -0.5;
    }
    PathRect(this,&local_18,&local_20,rounding,rounding_corners_flags);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& a, const ImVec2& b, ImU32 col, float rounding, int rounding_corners_flags, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(a + ImVec2(0.5f,0.5f), b - ImVec2(0.50f,0.50f), rounding, rounding_corners_flags);
    else
        PathRect(a + ImVec2(0.5f,0.5f), b - ImVec2(0.49f,0.49f), rounding, rounding_corners_flags); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}